

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
llbuild::buildsystem::BuildSystem::attachDB(BuildSystem *this,StringRef path,string *error_out)

{
  bool bVar1;
  string *error_out_local;
  BuildSystem *this_local;
  StringRef path_local;
  
  bVar1 = anon_unknown.dwarf_60e82::BuildSystemImpl::attachDB
                    ((BuildSystemImpl *)this->impl,path,error_out);
  return bVar1;
}

Assistant:

bool BuildSystem::attachDB(StringRef path,
                                std::string* error_out) {
  return static_cast<BuildSystemImpl*>(impl)->attachDB(path, error_out);
}